

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

void Vec_WrdPushOrder(Vec_Wrd_t *p,word Entry)

{
  int local_1c;
  int i;
  word Entry_local;
  Vec_Wrd_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_WrdGrow(p,0x10);
    }
    else {
      Vec_WrdGrow(p,p->nCap << 1);
    }
  }
  p->nSize = p->nSize + 1;
  for (local_1c = p->nSize + -2; (-1 < local_1c && (Entry < p->pArray[local_1c]));
      local_1c = local_1c + -1) {
    p->pArray[local_1c + 1] = p->pArray[local_1c];
  }
  p->pArray[local_1c + 1] = Entry;
  return;
}

Assistant:

static inline void Vec_WrdPushOrder( Vec_Wrd_t * p, word Entry )
{
    int i;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WrdGrow( p, 16 );
        else
            Vec_WrdGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( p->pArray[i] > Entry )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}